

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<int,float>(Map<int,_float> *dest,Map<int,_float> *src)

{
  float fVar1;
  float *pfVar2;
  const_iterator __begin0;
  UntypedMapIterator local_28;
  
  UntypedMapBase::begin(&local_28,(UntypedMapBase *)src);
  while (local_28.node_ != (NodeBase *)0x0) {
    fVar1 = *(float *)((long)&local_28.node_[1].next + 4);
    pfVar2 = Map<int,_float>::operator[]<int>(dest,(key_arg<int> *)(local_28.node_ + 1));
    *pfVar2 = fVar1;
    UntypedMapIterator::PlusPlus(&local_28);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}